

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

void __thiscall
btWheelContactPoint::btWheelContactPoint
          (btWheelContactPoint *this,btRigidBody *body0,btRigidBody *body1,
          btVector3 *frictionPosWorld,btVector3 *frictionDirectionWorld,btScalar maxImpulse)

{
  undefined8 uVar1;
  btScalar bVar2;
  btScalar bVar3;
  
  this->m_body0 = body0;
  this->m_body1 = body1;
  uVar1 = *(undefined8 *)(frictionPosWorld->m_floats + 2);
  *(undefined8 *)(this->m_frictionPositionWorld).m_floats =
       *(undefined8 *)frictionPosWorld->m_floats;
  *(undefined8 *)((this->m_frictionPositionWorld).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(frictionDirectionWorld->m_floats + 2);
  *(undefined8 *)(this->m_frictionDirectionWorld).m_floats =
       *(undefined8 *)frictionDirectionWorld->m_floats;
  *(undefined8 *)((this->m_frictionDirectionWorld).m_floats + 2) = uVar1;
  this->m_maxImpulse = maxImpulse;
  bVar2 = btRigidBody::computeImpulseDenominator(body0,frictionPosWorld,frictionDirectionWorld);
  bVar3 = btRigidBody::computeImpulseDenominator(body1,frictionPosWorld,frictionDirectionWorld);
  this->m_jacDiagABInv = 1.0 / (bVar3 + bVar2);
  return;
}

Assistant:

btWheelContactPoint(btRigidBody* body0,btRigidBody* body1,const btVector3& frictionPosWorld,const btVector3& frictionDirectionWorld, btScalar maxImpulse)
		:m_body0(body0),
		m_body1(body1),
		m_frictionPositionWorld(frictionPosWorld),
		m_frictionDirectionWorld(frictionDirectionWorld),
		m_maxImpulse(maxImpulse)
	{
		btScalar denom0 = body0->computeImpulseDenominator(frictionPosWorld,frictionDirectionWorld);
		btScalar denom1 = body1->computeImpulseDenominator(frictionPosWorld,frictionDirectionWorld);
		btScalar	relaxation = 1.f;
		m_jacDiagABInv = relaxation/(denom0+denom1);
	}